

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O3

int Cbs_ManSolve_rec(Cbs_Man_t *p,int Level)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t **ppGVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  uint uVar12;
  int Level_00;
  ulong uVar13;
  long lVar14;
  Gia_Obj_t *pGVar15;
  long lVar16;
  bool bVar17;
  
  if ((p->pProp).iHead == (p->pProp).iTail) {
    __assert_fail("!Cbs_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x372,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
  }
  iVar6 = Cbs_ManPropagate(p,Level);
  if (iVar6 != 0) {
    return iVar6;
  }
  iVar6 = (p->pProp).iHead;
  if (iVar6 != (p->pProp).iTail) {
    __assert_fail("Cbs_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x376,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
  }
  iVar2 = (p->pJust).iHead;
  iVar3 = (p->pJust).iTail;
  iVar7 = iVar3 - iVar2;
  if (iVar7 == 0) {
    return 0;
  }
  iVar8 = (p->Pars).nJustThis;
  if (iVar7 < iVar8) {
    iVar7 = iVar8;
  }
  (p->Pars).nJustThis = iVar7;
  if ((p->Pars).nJustLimit < iVar7) {
    return 0;
  }
  if ((p->Pars).nBTLimit < (p->Pars).nBTThis) {
    return 0;
  }
  lVar16 = (long)iVar3;
  iVar7 = iVar3;
  if (iVar2 < iVar3) {
    lVar14 = (long)iVar2;
    do {
      ppGVar9 = (p->pJust).pData;
      pGVar11 = ppGVar9[lVar14];
      if (((ulong)pGVar11 & 1) != 0) {
        __assert_fail("!Gia_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                      ,0x120,"void Cbs_QuePush(Cbs_Que_t *, Gia_Obj_t *)");
      }
      iVar8 = iVar7;
      if (iVar7 == (p->pJust).nSize) {
        (p->pJust).nSize = iVar7 * 2;
        ppGVar9 = (Gia_Obj_t **)realloc(ppGVar9,(long)(iVar7 * 2) << 3);
        iVar8 = (p->pJust).iTail;
        (p->pJust).pData = ppGVar9;
      }
      iVar7 = iVar8 + 1;
      (p->pJust).iTail = iVar7;
      ppGVar9[iVar8] = pGVar11;
      lVar14 = lVar14 + 1;
    } while (lVar16 != lVar14);
  }
  (p->pJust).iHead = iVar3;
  if ((p->Pars).fUseHighest == 0) {
    if ((p->Pars).fUseLowest == 0) {
      if ((p->Pars).fUseMaxFF == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                      ,0x387,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
      }
      pGVar11 = Cbs_ManDecideMaxFF(p);
      goto LAB_0072259e;
    }
    if (iVar3 < iVar7) {
      pGVar11 = (Gia_Obj_t *)0x0;
      do {
        pGVar15 = (p->pJust).pData[lVar16];
        if (pGVar15 == (Gia_Obj_t *)0x0) break;
        pGVar10 = pGVar11;
        if (pGVar15 < pGVar11) {
          pGVar10 = pGVar15;
        }
        bVar17 = pGVar11 == (Gia_Obj_t *)0x0;
        pGVar11 = pGVar10;
        if (bVar17) {
          pGVar11 = pGVar15;
        }
        lVar16 = lVar16 + 1;
      } while (iVar7 != lVar16);
      goto LAB_0072259e;
    }
  }
  else if (iVar3 < iVar7) {
    pGVar11 = (Gia_Obj_t *)0x0;
    do {
      pGVar15 = (p->pJust).pData[lVar16];
      if (pGVar15 == (Gia_Obj_t *)0x0) break;
      if (pGVar11 < pGVar15) {
        pGVar11 = pGVar15;
      }
      lVar16 = lVar16 + 1;
    } while (iVar7 != lVar16);
    goto LAB_0072259e;
  }
  pGVar11 = (Gia_Obj_t *)0x0;
LAB_0072259e:
  uVar4 = *(ulong *)pGVar11;
  if (((((int)(uint)uVar4 < 0) || (uVar12 = (uint)uVar4 & 0x1fffffff, uVar12 == 0x1fffffff)) ||
      ((pGVar11[-(ulong)uVar12].field_0x3 & 0x40) != 0)) ||
     (uVar13 = (ulong)((uint)(uVar4 >> 0x20) & 0x1fffffff), (pGVar11[-uVar13].field_0x3 & 0x40) != 0
     )) {
    __assert_fail("Cbs_VarIsJust( pVar )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat.c"
                  ,0x388,"int Cbs_ManSolve_rec(Cbs_Man_t *, int)");
  }
  pGVar15 = pGVar11 + -(ulong)uVar12;
  pGVar5 = p->pAig;
  pGVar10 = pGVar5->pObjs;
  if (((pGVar10 <= pGVar15) && (pGVar15 < pGVar10 + pGVar5->nObjs)) &&
     ((pGVar11 = pGVar11 + -uVar13, pGVar10 <= pGVar11 && (pGVar11 < pGVar10 + pGVar5->nObjs)))) {
    iVar8 = pGVar5->pRefs[(int)((ulong)((long)pGVar15 - (long)pGVar10) >> 2) * -0x55555555];
    iVar7 = pGVar5->pRefs[(int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * -0x55555555];
    if (iVar7 < iVar8) {
      pGVar11 = pGVar15;
    }
    pGVar15 = (Gia_Obj_t *)
              ((ulong)((uVar4 >> ((iVar8 <= iVar7) << 5 | 0x1dU) & 1) != 0) ^ (ulong)pGVar11);
    Level_00 = Level + 1;
    Cbs_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar15 ^ 1),Level_00,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
    iVar8 = Cbs_ManSolve_rec(p,Level_00);
    iVar7 = 0;
    if ((iVar8 != 0) &&
       (pGVar10 = (p->pClauses).pData[iVar8], iVar7 = iVar8,
       pGVar10 == (Gia_Obj_t *)((ulong)pGVar11 & 0xfffffffffffffffe))) {
      Cbs_ManCancelUntil(p,iVar6);
      (p->pJust).iHead = iVar2;
      (p->pJust).iTail = iVar3;
      Cbs_ManAssign(p,pGVar15,Level_00,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
      iVar6 = Cbs_ManSolve_rec(p,Level_00);
      iVar7 = 0;
      if ((iVar6 != 0) && (ppGVar9 = (p->pClauses).pData, iVar7 = iVar6, ppGVar9[iVar6] == pGVar10))
      {
        iVar7 = Cbs_ManResolve(p,iVar8,iVar6,(int)ppGVar9);
        piVar1 = &(p->Pars).nBTThis;
        *piVar1 = *piVar1 + 1;
      }
    }
    return iVar7;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Cbs_ManSolve_rec( Cbs_Man_t * p, int Level )
{ 
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pVar = NULL, * pDecVar;
    int hClause, hLearn0, hLearn1;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Cbs_QueIsEmpty(&p->pProp) );
    if ( (hClause = Cbs_ManPropagate( p, Level )) )
        return hClause;
    // check for satisfying assignment
    assert( Cbs_QueIsEmpty(&p->pProp) );
    if ( Cbs_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Cbs_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseHighest )
        pVar = Cbs_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Cbs_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Cbs_ManDecideMaxFF( p );
    else assert( 0 );
    assert( Cbs_VarIsJust( pVar ) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
        pDecVar = Gia_Not(Gia_ObjChild0(pVar));
    else
        pDecVar = Gia_Not(Gia_ObjChild1(pVar));
//    pDecVar = Gia_NotCond( Gia_Regular(pDecVar), Gia_Regular(pDecVar)->fPhase );
//    pDecVar = Gia_Not(pDecVar);
    // decide on first fanin
    Cbs_ManAssign( p, pDecVar, Level+1, NULL, NULL );
    if ( !(hLearn0 = Cbs_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0] != Gia_Regular(pDecVar) )
        return hLearn0;
    Cbs_ManCancelUntil( p, iPropHead );
    Cbs_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs_ManAssign( p, Gia_Not(pDecVar), Level+1, NULL, NULL );
    if ( !(hLearn1 = Cbs_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1] != Gia_Regular(pDecVar) )
        return hLearn1;
    hClause = Cbs_ManResolve( p, Level, hLearn0, hLearn1 );
//    Cbs_ManPrintClauseNew( p, Level, hClause );
//    if ( Level > Cbs_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}